

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_core.cpp
# Opt level: O2

int luaopen_emmy_core(lua_State *L)

{
  bool bVar1;
  EmmyFacade *this;
  
  this = EmmyFacade::Get();
  EmmyFacade::SetWorkMode(this,EmmyCore);
  bVar1 = install_emmy_debugger(L);
  if (bVar1) {
    (*lua_createtable)(L,0,9);
    luaL_setfuncs(L,lib,0);
    lua_pushglobaltable(L);
    (*lua_pushstring)(L,"emmy_core");
    (*lua_pushvalue)(L,-3);
    (*lua_rawset)(L,-3);
    (*lua_settop)(L,-2);
  }
  return (uint)bVar1;
}

Assistant:

EMMY_CORE_EXPORT int luaopen_emmy_core(struct lua_State* L) {
		EmmyFacade::Get().SetWorkMode(WorkMode::EmmyCore);
		if (!install_emmy_debugger(L))
			return false;
		luaL_newlibtable(L, lib);
		luaL_setfuncs(L, lib, 0);

		// _G.emmy_core
		lua_pushglobaltable(L);
		lua_pushstring(L, "emmy_core");
		lua_pushvalue(L, -3);
		lua_rawset(L, -3);
		lua_pop(L, 1);
		
		return 1;
	}